

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O1

void __thiscall Context<false>::Context(Context<false> *this)

{
  (this->error_ptr)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->namespace_path).super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->namespace_path).super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->namespace_path).super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->default_state).super_BaseState<false>.name = "Default";
  (this->default_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d9790;
  (this->label_state).super_BaseState<false>.name = "Label";
  (this->label_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d9878;
  (this->label_object_state).super_BaseState<false>.name = "LabelObject";
  (this->label_object_state).super_BaseState<false>._vptr_BaseState =
       (_func_int **)&PTR_Null_002d98f0;
  (this->label_single_property_state).super_BaseState<false>.name = "LabelSingleProperty";
  (this->label_single_property_state).super_BaseState<false>._vptr_BaseState =
       (_func_int **)&PTR_Null_002d9968;
  (this->label_index_state).super_BaseState<false>.name = "LabelIndex";
  (this->label_index_state).super_BaseState<false>._vptr_BaseState =
       (_func_int **)&PTR_Null_002d99e0;
  (this->label_index_state).index = -1;
  (this->text_state).super_BaseState<false>.name = "text";
  (this->text_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d9a58;
  (this->tag_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d9818;
  (this->tag_state).super_BaseState<false>.name = "tag";
  (this->tag_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d9ad0;
  (this->multi_state).super_BaseState<false>.name = "Multi";
  (this->multi_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d9b48;
  (this->ignore_state).super_BaseState<false>.name = "Ignore";
  (this->ignore_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d9bc0;
  (this->array_state).super_BaseState<false>.name = "Array";
  (this->array_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d9c38;
  (this->decision_service_state).super_BaseState<false>.name = "DecisionService";
  (this->decision_service_state).super_BaseState<false>._vptr_BaseState =
       (_func_int **)&PTR_Null_002d9cb0;
  (this->array_float_state).super_BaseState<false>.name = "ArrayToVectorState";
  (this->array_float_state).super_BaseState<false>._vptr_BaseState =
       (_func_int **)&PTR_Null_002d9d28;
  (this->array_uint_state).super_BaseState<false>.name = "ArrayToVectorState";
  (this->array_uint_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d9da0
  ;
  (this->string_state).super_BaseState<false>.name = "StringToStringState";
  (this->string_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d9e18;
  (this->float_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d9818;
  (this->float_state).super_BaseState<false>.name = "FloatToFloatState";
  (this->float_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d9e90;
  (this->bool_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d9818;
  (this->bool_state).super_BaseState<false>.name = "BoolToBoolState";
  (this->bool_state).super_BaseState<false>._vptr_BaseState = (_func_int **)&PTR_Null_002d9f08;
  this->current_state = &(this->default_state).super_BaseState<false>;
  this->root_state = &(this->default_state).super_BaseState<false>;
  return;
}

Assistant:

Context()
  {
    current_state = &default_state;
    root_state = &default_state;
  }